

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TreeIncPruneBGPlanner.cpp
# Opt level: O0

void __thiscall
TreeIncPruneBGPlanner::AddToCache_CrossSum
          (TreeIncPruneBGPlanner *this,Index a,Index depth,
          vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
          *jpol,VectorSet *G)

{
  matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
  *in_RCX;
  undefined4 in_EDX;
  undefined4 in_ESI;
  long in_RDI;
  string key;
  string *in_stack_00000190;
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  *in_stack_00000198;
  Index in_stack_000001a0;
  Index in_stack_000001a4;
  TreeIncPruneBGPlanner *in_stack_000001a8;
  allocator<char> *in_stack_ffffffffffffff90;
  key_type *in_stack_ffffffffffffff98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffa0;
  string local_40 [64];
  
  if ((*(byte *)(in_RDI + 0x216) & 1) != 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffffa0,(char *)in_stack_ffffffffffffff98,in_stack_ffffffffffffff90
              );
    ComputeKey(in_stack_000001a8,in_stack_000001a4,in_stack_000001a0,in_stack_00000198,
               in_stack_00000190);
    std::__cxx11::string::~string((string *)&stack0xffffffffffffffa0);
    std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffff9f);
    std::
    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_>_>_>
    ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_>_>_>
                  *)in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
    boost::numeric::ublas::
    matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
    ::operator=(in_RCX,(matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
                        *)CONCAT44(in_EDX,in_ESI));
    std::__cxx11::string::~string(local_40);
  }
  return;
}

Assistant:

void TreeIncPruneBGPlanner::AddToCache_CrossSum(Index a,
                                                Index depth,
                                                const vector<vector<Index> > &jpol,
                                                const VectorSet &G)
{
    if(!_m_useVectorCache)
        return;

    string key=ComputeKey(a,depth,jpol,"CrossSum");

#if DEBUG_TreeIncPruneBGPlannerVerbose
    cout << "Adding CrossSum node to cache with key " << key 
#endif
#if 0
         << " vectorset " << SoftPrint(G) 
#endif
#if DEBUG_TreeIncPruneBGPlannerVerbose
         << " (jpol " << SoftPrintJpol(jpol) << ")" << endl;
#endif
    _m_vectorSetCache[key]=G;//.insert(std::pair<key,G>);
}